

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O3

void __thiscall icu_63::TZGNCore::loadStrings(TZGNCore *this,UnicodeString *tzCanonicalID)

{
  ushort uVar1;
  UBool UVar2;
  int iVar3;
  undefined4 extraout_var;
  UnicodeString *mzID;
  undefined4 uVar4;
  long lVar5;
  bool bVar6;
  UErrorCode status;
  UnicodeString goldenID;
  UnicodeString mzGenName;
  int local_c4;
  long *local_c0;
  char *local_b8;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  getGenericLocationName(this,tzCanonicalID);
  local_c4 = 0;
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar3 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[6])
                    (this->fTimeZoneNames,tzCanonicalID);
  local_c0 = (long *)CONCAT44(extraout_var,iVar3);
  local_b8 = this->fTargetRegion;
  while( true ) {
    mzID = (UnicodeString *)(**(code **)(*local_c0 + 0x38))(local_c0,&local_c4);
    if ((mzID == (UnicodeString *)0x0) || (0 < local_c4)) {
      (**(code **)(*local_c0 + 8))();
      icu_63::UnicodeString::~UnicodeString(&local_70);
      icu_63::UnicodeString::~UnicodeString(&local_b0);
      return;
    }
    (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
              (this->fTimeZoneNames,mzID,local_b8,&local_b0);
    uVar1 = (tzCanonicalID->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) break;
    bVar6 = (bool)(local_b0.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
LAB_0027fa21:
    if (bVar6 == false) {
LAB_0027fa29:
      lVar5 = 0;
      do {
        (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[9])
                  (this->fTimeZoneNames,mzID,(ulong)*(uint *)((long)&DAT_003a15f0 + lVar5),&local_70
                  );
        if (0x1f < (ushort)local_70.fUnion.fStackFields.fLengthAndFlags) {
          getPartialLocationName(this,tzCanonicalID,mzID,lVar5 == 0,&local_70);
        }
        lVar5 = lVar5 + 4;
      } while (lVar5 != 8);
    }
  }
  if ((short)uVar1 < 0) {
    iVar3 = (tzCanonicalID->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)(short)uVar1 >> 5;
  }
  uVar4 = local_b0.fUnion.fFields.fLength;
  if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
    uVar4 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if ((((int)local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) && (iVar3 == uVar4)) {
    UVar2 = icu_63::UnicodeString::doEquals(tzCanonicalID,&local_b0,iVar3);
    bVar6 = UVar2 != '\0';
    goto LAB_0027fa21;
  }
  goto LAB_0027fa29;
}

Assistant:

void
TZGNCore::loadStrings(const UnicodeString& tzCanonicalID) {
    // load the generic location name
    getGenericLocationName(tzCanonicalID);

    // partial location names
    UErrorCode status = U_ZERO_ERROR;

    const UnicodeString *mzID;
    UnicodeString goldenID;
    UnicodeString mzGenName;
    UTimeZoneNameType genNonLocTypes[] = {
        UTZNM_LONG_GENERIC, UTZNM_SHORT_GENERIC,
        UTZNM_UNKNOWN /*terminator*/
    };

    StringEnumeration *mzIDs = fTimeZoneNames->getAvailableMetaZoneIDs(tzCanonicalID, status);
    while ((mzID = mzIDs->snext(status)) != NULL) {
        if (U_FAILURE(status)) {
            break;
        }
        // if this time zone is not the golden zone of the meta zone,
        // partial location name (such as "PT (Los Angeles)") might be
        // available.
        fTimeZoneNames->getReferenceZoneID(*mzID, fTargetRegion, goldenID);
        if (tzCanonicalID != goldenID) {
            for (int32_t i = 0; genNonLocTypes[i] != UTZNM_UNKNOWN; i++) {
                fTimeZoneNames->getMetaZoneDisplayName(*mzID, genNonLocTypes[i], mzGenName);
                if (!mzGenName.isEmpty()) {
                    // getPartialLocationName formats a name and put it into the trie
                    getPartialLocationName(tzCanonicalID, *mzID,
                        (genNonLocTypes[i] == UTZNM_LONG_GENERIC), mzGenName);
                }
            }
        }
    }
    if (mzIDs != NULL) {
        delete mzIDs;
    }
}